

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O1

bool __thiscall
ON_Plane::GetDistanceToBoundingBox(ON_Plane *this,ON_BoundingBox *Box,double *min,double *max)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_3dVector UnitNormal;
  ON_3dPoint P;
  double local_a0;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  local_78.z = (this->zaxis).z;
  local_78.x = (this->zaxis).x;
  local_78.y = (this->zaxis).y;
  bVar3 = ON_3dVector::Unitize(&local_78);
  if (bVar3) {
    ON_BoundingBox::Min(Box);
    ON_3dPoint::operator-(&local_48,&local_60,&this->origin);
    dVar8 = ON_3dVector::operator*(&local_48,&local_78);
    local_a0 = dVar8;
    iVar2 = 0;
    do {
      iVar6 = 0;
      do {
        iVar5 = 0;
        dVar10 = dVar8;
        do {
          dVar8 = dVar10;
          dVar1 = local_a0;
          if ((iVar6 != 0 || iVar2 != 0) || iVar5 != 0) {
            if (iVar2 == 0) {
              ON_BoundingBox::Min(Box);
            }
            else {
              ON_BoundingBox::Max(Box);
            }
            pdVar4 = ON_3dPoint::operator[](&local_60,0);
            dVar1 = *pdVar4;
            pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,0);
            *pdVar4 = dVar1;
            if (iVar6 == 0) {
              ON_BoundingBox::Min(Box);
            }
            else {
              ON_BoundingBox::Max(Box);
            }
            pdVar4 = ON_3dPoint::operator[](&local_60,1);
            dVar1 = *pdVar4;
            pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,1);
            *pdVar4 = dVar1;
            if (iVar5 == 0) {
              ON_BoundingBox::Min(Box);
            }
            else {
              ON_BoundingBox::Max(Box);
            }
            pdVar4 = ON_3dPoint::operator[](&local_60,2);
            dVar1 = *pdVar4;
            pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,2);
            *pdVar4 = dVar1;
            ON_3dPoint::operator-((ON_3dVector *)&local_60,(ON_3dPoint *)&local_48,&this->origin);
            dVar9 = ON_3dVector::operator*((ON_3dVector *)&local_60,&local_78);
            dVar1 = dVar9;
            if ((local_a0 <= dVar9) && (dVar8 = dVar9, dVar1 = local_a0, dVar9 <= dVar10)) {
              dVar8 = dVar10;
            }
          }
          local_a0 = dVar1;
          iVar5 = iVar5 + 1;
          dVar10 = dVar8;
        } while (iVar5 == 1);
        bVar7 = iVar6 == 0;
        iVar6 = iVar6 + 1;
      } while (bVar7);
      bVar7 = iVar2 == 0;
      iVar2 = iVar2 + 1;
    } while (bVar7);
    *min = local_a0;
    *max = dVar8;
  }
  return bVar3;
}

Assistant:

bool ON_Plane::GetDistanceToBoundingBox(const ON_BoundingBox& Box,
				                                double* min, double* max) const
{
  //min and max signed distance.  Returns false if plane normal has zero length.

  ON_3dVector UnitNormal = Normal();
  if (!UnitNormal.Unitize()) 
    return false;

  double mind, maxd;
  mind = maxd = (Box.Min() - Origin())*UnitNormal;
  int i0, i1, i2;
  for (i0=0;i0<2;i0++)
  {
    for(i1=0;i1<2;i1++) 
    {
      for (i2=0;i2<2;i2++) 
      {
        if (i0||i1||i2) 
        {
          ON_3dPoint P;
          P[0]=(i0)?Box.Max()[0]:Box.Min()[0];
          P[1]=(i1)?Box.Max()[1]:Box.Min()[1];
          P[2]=(i2)?Box.Max()[2]:Box.Min()[2];
          double d = (P - Origin())*UnitNormal;
          //double dd = P.DistanceTo(ClosestPointTo(P));
          if (d < mind) 
            mind=d;
          else if (d > maxd) 
            maxd=d;
        }
      }
    }
  }
  *min = mind;
  *max = maxd;
  return true;
}